

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImGuiID IVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Pos).x = (float)(int)auVar4._0_8_;
  (this->Pos).y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  (this->Size).x = (float)(int)auVar4._8_8_;
  (this->Size).y = (float)(int)((ulong)auVar4._8_8_ >> 0x20);
  (this->SizeFull).x = (float)(int)auVar4._16_8_;
  (this->SizeFull).y = (float)(int)((ulong)auVar4._16_8_ >> 0x20);
  (this->ContentSize).x = (float)(int)auVar4._24_8_;
  (this->ContentSize).y = (float)(int)((ulong)auVar4._24_8_ >> 0x20);
  (this->ContentSize).x = (float)(int)auVar4._0_8_;
  (this->ContentSize).y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  (this->ContentSizeIdeal).x = (float)(int)auVar4._8_8_;
  (this->ContentSizeIdeal).y = (float)(int)((ulong)auVar4._8_8_ >> 0x20);
  (this->ContentSizeExplicit).x = (float)(int)auVar4._16_8_;
  (this->ContentSizeExplicit).y = (float)(int)((ulong)auVar4._16_8_ >> 0x20);
  (this->WindowPadding).x = (float)(int)auVar4._24_8_;
  (this->WindowPadding).y = (float)(int)((ulong)auVar4._24_8_ >> 0x20);
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Scroll).x = (float)(int)auVar4._0_8_;
  (this->Scroll).y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  (this->ScrollMax).x = (float)(int)auVar4._8_8_;
  (this->ScrollMax).y = (float)(int)((ulong)auVar4._8_8_ >> 0x20);
  (this->ScrollTarget).x = (float)(int)auVar4._16_8_;
  (this->ScrollTarget).y = (float)(int)((ulong)auVar4._16_8_ >> 0x20);
  (this->ScrollTargetCenterRatio).x = (float)(int)auVar4._24_8_;
  (this->ScrollTargetCenterRatio).y = (float)(int)((ulong)auVar4._24_8_ >> 0x20);
  (this->ScrollTarget).x = (float)(int)auVar4._0_8_;
  (this->ScrollTarget).y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  (this->ScrollTargetCenterRatio).x = (float)(int)auVar4._8_8_;
  (this->ScrollTargetCenterRatio).y = (float)(int)((ulong)auVar4._8_8_ >> 0x20);
  (this->ScrollTargetEdgeSnapDist).x = (float)(int)auVar4._16_8_;
  (this->ScrollTargetEdgeSnapDist).y = (float)(int)((ulong)auVar4._16_8_ >> 0x20);
  (this->ScrollbarSizes).x = (float)(int)auVar4._24_8_;
  (this->ScrollbarSizes).y = (float)(int)((ulong)auVar4._24_8_ >> 0x20);
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  memset(this,0,1000);
  pcVar2 = ImStrdup(name);
  this->Name = pcVar2;
  sVar3 = strlen(name);
  this->NameBufLen = (int)sVar3 + 1;
  IVar1 = ImHashStr(name,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  IVar1 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar1;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xaf = (uint)(byte)this->field_0xb2 << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}